

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

DecodeStatus decodeBDAddr20Operand(MCInst *Inst,uint64_t Field,uint *Regs)

{
  int64_t Val;
  long in_RDX;
  ulong in_RSI;
  MCInst *in_RDI;
  uint64_t Disp;
  uint64_t Base;
  undefined4 local_34;
  
  if (in_RSI >> 0x14 == 0) {
    local_34 = 0;
  }
  else {
    local_34 = *(uint *)(in_RDX + (in_RSI >> 0x14) * 4);
  }
  MCOperand_CreateReg0(in_RDI,local_34);
  Val = SignExtend64((in_RSI & 0xff) << 0xc | in_RSI >> 8 & 0xfff,0x14);
  MCOperand_CreateImm0(in_RDI,Val);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus decodeBDAddr20Operand(MCInst *Inst, uint64_t Field,
		const unsigned *Regs)
{
	uint64_t Base = Field >> 20;
	uint64_t Disp = ((Field << 12) & 0xff000) | ((Field >> 8) & 0xfff);
	//assert(Base < 16 && "Invalid BDAddr20");

	MCOperand_CreateReg0(Inst, Base == 0 ? 0 : Regs[Base]);
	MCOperand_CreateImm0(Inst, SignExtend64(Disp, 20));
	return MCDisassembler_Success;
}